

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O0

Result<std::pair<unsigned_int,_wasm::Name>_> * __thiscall
wasm::IRBuilder::getExtraOutputLocalAndLabel
          (Result<std::pair<unsigned_int,_wasm::Name>_> *__return_storage_ptr__,IRBuilder *this,
          Index label,size_t extraArity)

{
  __index_type *__return_storage_ptr___00;
  allocator<wasm::Type> *this_00;
  uint uVar1;
  ScopeCtx *this_01;
  ScopeCtx **ppSVar2;
  size_type __n;
  size_type sVar3;
  IString *this_02;
  Err *pEVar4;
  uint *puVar5;
  reference pvVar6;
  Name *pNVar7;
  reference pvVar8;
  bool bVar9;
  Iterator __first;
  Iterator __last;
  pair<unsigned_int,_wasm::Name> local_210;
  size_t local_1f8;
  char *pcStack_1f0;
  string_view local_1e8;
  undefined1 local_1d8 [8];
  Result<wasm::Name> name;
  Err *err_1;
  Result<unsigned_int> _val_1;
  undefined1 local_158 [8];
  Result<unsigned_int> local;
  Tuple local_100;
  Type local_e8;
  Type extraType;
  Iterator it;
  Type labelType;
  size_t i;
  ScopeCtx *s;
  Err local_b0;
  Err *local_90;
  Err *err;
  undefined1 local_78 [8];
  Result<wasm::IRBuilder::ScopeCtx_*> _val;
  Result<wasm::IRBuilder::ScopeCtx_*> scope;
  size_t extraArity_local;
  Index label_local;
  IRBuilder *this_local;
  
  __return_storage_ptr___00 =
       (__index_type *)
       ((long)&_val.val.super__Variant_base<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
               super__Move_assign_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
               super__Copy_assign_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
               super__Move_ctor_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
               super__Copy_ctor_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err> + 0x20);
  getScope((Result<wasm::IRBuilder::ScopeCtx_*> *)__return_storage_ptr___00,this,label);
  Result<wasm::IRBuilder::ScopeCtx_*>::Result
            ((Result<wasm::IRBuilder::ScopeCtx_*> *)local_78,
             (Result<wasm::IRBuilder::ScopeCtx_*> *)__return_storage_ptr___00);
  local_90 = Result<wasm::IRBuilder::ScopeCtx_*>::getErr
                       ((Result<wasm::IRBuilder::ScopeCtx_*> *)local_78);
  bVar9 = local_90 == (Err *)0x0;
  if (!bVar9) {
    wasm::Err::Err(&local_b0,local_90);
    Result<std::pair<unsigned_int,_wasm::Name>_>::Result(__return_storage_ptr__,&local_b0);
    wasm::Err::~Err(&local_b0);
  }
  Result<wasm::IRBuilder::ScopeCtx_*>::~Result((Result<wasm::IRBuilder::ScopeCtx_*> *)local_78);
  if (bVar9) {
    ppSVar2 = Result<wasm::IRBuilder::ScopeCtx_*>::operator*
                        ((Result<wasm::IRBuilder::ScopeCtx_*> *)
                         ((long)&_val.val.
                                 super__Variant_base<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                                 super__Move_assign_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                                 super__Copy_assign_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                                 super__Move_ctor_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                                 super__Copy_ctor_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err> +
                         0x20));
    this_01 = *ppSVar2;
    __n = extraArity - 1;
    sVar3 = std::vector<wasm::Name,_std::allocator<wasm::Name>_>::size(&this_01->outputLabels);
    if (sVar3 < extraArity) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                (&this_01->outputLocals,extraArity);
      std::vector<wasm::Name,_std::allocator<wasm::Name>_>::resize
                (&this_01->outputLabels,extraArity);
    }
    this_02 = &std::vector<wasm::Name,_std::allocator<wasm::Name>_>::operator[]
                         (&this_01->outputLabels,__n)->super_IString;
    bVar9 = IString::operator_cast_to_bool(this_02);
    if (!bVar9) {
      it.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index =
           (size_t)ScopeCtx::getLabelType(this_01);
      __first = wasm::Type::begin((Type *)&it.
                                           super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                           .index);
      it.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
           (Type *)__first.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index
      ;
      extraType.id = (uintptr_t)
                     __first.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                     parent;
      __last = ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>::operator+
                         ((ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *)
                          &extraType,extraArity);
      this_00 = (allocator<wasm::Type> *)
                ((long)&local.val.super__Variant_base<unsigned_int,_wasm::Err>.
                        super__Move_assign_alias<unsigned_int,_wasm::Err>.
                        super__Copy_assign_alias<unsigned_int,_wasm::Err>.
                        super__Move_ctor_alias<unsigned_int,_wasm::Err>.
                        super__Copy_ctor_alias<unsigned_int,_wasm::Err> + 0x27);
      std::allocator<wasm::Type>::allocator(this_00);
      std::vector<wasm::Type,std::allocator<wasm::Type>>::vector<wasm::Type::Iterator,void>
                ((vector<wasm::Type,std::allocator<wasm::Type>> *)&local_100,__first,__last,this_00)
      ;
      wasm::Type::Type(&local_e8,&local_100);
      std::vector<wasm::Type,_std::allocator<wasm::Type>_>::~vector(&local_100);
      std::allocator<wasm::Type>::~allocator
                ((allocator<wasm::Type> *)
                 ((long)&local.val.super__Variant_base<unsigned_int,_wasm::Err>.
                         super__Move_assign_alias<unsigned_int,_wasm::Err>.
                         super__Copy_assign_alias<unsigned_int,_wasm::Err>.
                         super__Move_ctor_alias<unsigned_int,_wasm::Err>.
                         super__Copy_ctor_alias<unsigned_int,_wasm::Err> + 0x27));
      _val_1.val.super__Variant_base<unsigned_int,_wasm::Err>.
      super__Move_assign_alias<unsigned_int,_wasm::Err>.
      super__Copy_assign_alias<unsigned_int,_wasm::Err>.
      super__Move_ctor_alias<unsigned_int,_wasm::Err>.
      super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
      super__Variant_storage_alias<unsigned_int,_wasm::Err>._32_8_ = local_e8.id;
      addScratchLocal((Result<unsigned_int> *)local_158,this,local_e8);
      Result<unsigned_int>::Result((Result<unsigned_int> *)&err_1,(Result<unsigned_int> *)local_158)
      ;
      pEVar4 = Result<unsigned_int>::getErr((Result<unsigned_int> *)&err_1);
      bVar9 = pEVar4 != (Err *)0x0;
      if (bVar9) {
        wasm::Err::Err((Err *)((long)&name.val.super__Variant_base<wasm::Name,_wasm::Err>.
                                      super__Move_assign_alias<wasm::Name,_wasm::Err>.
                                      super__Copy_assign_alias<wasm::Name,_wasm::Err>.
                                      super__Move_ctor_alias<wasm::Name,_wasm::Err>.
                                      super__Copy_ctor_alias<wasm::Name,_wasm::Err> + 0x20),pEVar4);
        Result<std::pair<unsigned_int,_wasm::Name>_>::Result
                  (__return_storage_ptr__,
                   (Err *)((long)&name.val.super__Variant_base<wasm::Name,_wasm::Err>.
                                  super__Move_assign_alias<wasm::Name,_wasm::Err>.
                                  super__Copy_assign_alias<wasm::Name,_wasm::Err>.
                                  super__Move_ctor_alias<wasm::Name,_wasm::Err>.
                                  super__Copy_ctor_alias<wasm::Name,_wasm::Err> + 0x20));
        wasm::Err::~Err((Err *)((long)&name.val.super__Variant_base<wasm::Name,_wasm::Err>.
                                       super__Move_assign_alias<wasm::Name,_wasm::Err>.
                                       super__Copy_assign_alias<wasm::Name,_wasm::Err>.
                                       super__Move_ctor_alias<wasm::Name,_wasm::Err>.
                                       super__Copy_ctor_alias<wasm::Name,_wasm::Err> + 0x20));
      }
      Result<unsigned_int>::~Result((Result<unsigned_int> *)&err_1);
      if (!bVar9) {
        getLabelName((Result<wasm::Name> *)local_1d8,this,label,false);
        puVar5 = Result<unsigned_int>::operator*((Result<unsigned_int> *)local_158);
        uVar1 = *puVar5;
        pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (&this_01->outputLocals,__n);
        *pvVar6 = uVar1;
        pNVar7 = Result<wasm::Name>::operator*((Result<wasm::Name> *)local_1d8);
        local_1f8 = (pNVar7->super_IString).str._M_len;
        pcStack_1f0 = (pNVar7->super_IString).str._M_str;
        local_1e8 = (string_view)makeFresh(this,(Name)(pNVar7->super_IString).str,0);
        pvVar8 = std::vector<wasm::Name,_std::allocator<wasm::Name>_>::operator[]
                           (&this_01->outputLabels,__n);
        wasm::Name::operator=(pvVar8,(Name *)&local_1e8);
        Result<wasm::Name>::~Result((Result<wasm::Name> *)local_1d8);
      }
      Result<unsigned_int>::~Result((Result<unsigned_int> *)local_158);
      if (bVar9 && bVar9) goto LAB_026172f9;
    }
    pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this_01->outputLocals,__n);
    pvVar8 = std::vector<wasm::Name,_std::allocator<wasm::Name>_>::operator[]
                       (&this_01->outputLabels,__n);
    std::make_pair<unsigned_int&,wasm::Name&>(&local_210,pvVar6,pvVar8);
    Result<std::pair<unsigned_int,wasm::Name>>::Result<std::pair<unsigned_int,wasm::Name>>
              ((Result<std::pair<unsigned_int,wasm::Name>> *)__return_storage_ptr__,&local_210);
  }
LAB_026172f9:
  Result<wasm::IRBuilder::ScopeCtx_*>::~Result
            ((Result<wasm::IRBuilder::ScopeCtx_*> *)
             ((long)&_val.val.super__Variant_base<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                     super__Move_assign_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                     super__Copy_assign_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                     super__Move_ctor_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err> + 0x20));
  return __return_storage_ptr__;
}

Assistant:

Result<std::pair<Index, Name>>
IRBuilder::getExtraOutputLocalAndLabel(Index label, size_t extraArity) {
  auto scope = getScope(label);
  CHECK_ERR(scope);
  auto& s = **scope;
  auto i = extraArity - 1;
  if (s.outputLabels.size() < extraArity) {
    s.outputLocals.resize(extraArity);
    s.outputLabels.resize(extraArity);
  }
  if (!s.outputLabels[i]) {
    auto labelType = s.getLabelType();
    auto it = labelType.begin();
    Type extraType = Tuple(it, it + extraArity);
    auto local = addScratchLocal(extraType);
    CHECK_ERR(local);
    auto name = getLabelName(label);
    s.outputLocals[i] = *local;
    s.outputLabels[i] = makeFresh(*name);
  }

  return std::make_pair(s.outputLocals[i], s.outputLabels[i]);
}